

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

Track * __thiscall mkvmuxer::Tracks::GetTrackByNumber(Tracks *this,uint64_t track_number)

{
  uint32_t uVar1;
  uint64_t uVar2;
  int local_28;
  int32_t i;
  int32_t count;
  uint64_t track_number_local;
  Tracks *this_local;
  
  uVar1 = track_entries_size(this);
  local_28 = 0;
  while( true ) {
    if ((int)uVar1 <= local_28) {
      return (Track *)0x0;
    }
    uVar2 = Track::number(this->track_entries_[local_28]);
    if (uVar2 == track_number) break;
    local_28 = local_28 + 1;
  }
  return this->track_entries_[local_28];
}

Assistant:

Track* Tracks::GetTrackByNumber(uint64_t track_number) const {
  const int32_t count = track_entries_size();
  for (int32_t i = 0; i < count; ++i) {
    if (track_entries_[i]->number() == track_number)
      return track_entries_[i];
  }

  return NULL;
}